

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdbusmenuconnection_p.cpp
# Opt level: O2

void QDBusMenuConnection::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  if (_c == IndexOfMethod) {
    QtMocHelpers::indexOfMethod<void(QDBusMenuConnection::*)()>
              ((QtMocHelpers *)_a,(void **)trayIconRegistered,0,0);
    return;
  }
  if (_c == InvokeMetaMethod) {
    if (_id == 1) {
      dbusError((QDBusMenuConnection *)_o,(QDBusError *)_a[1]);
      return;
    }
    if (_id == 0) {
      trayIconRegistered((QDBusMenuConnection *)_o);
      return;
    }
  }
  return;
}

Assistant:

void QDBusMenuConnection::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDBusMenuConnection *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->trayIconRegistered(); break;
        case 1: _t->dbusError((*reinterpret_cast< std::add_pointer_t<QDBusError>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QDBusMenuConnection::*)()>(_a, &QDBusMenuConnection::trayIconRegistered, 0))
            return;
    }
}